

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  SliceLayerParams_SliceAxis SVar4;
  Tensor *this_00;
  SliceLayerParams *pSVar5;
  string *psVar6;
  uint64_t uVar7;
  int64_t iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string err_2;
  int64_t end;
  int64_t start;
  undefined1 local_180 [8];
  string err_1;
  int stride;
  SliceLayerParams *slice;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string err;
  bool sufficientInputRank;
  int rank;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_39 = 0;
  validateOutputCount(__return_storage_ptr__,local_20,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_39 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_39 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  if (((this->ndArrayInterpretation & 1U) == 0) ||
     (iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(local_20), layer_00 = local_20,
     iVar2 < 1)) goto LAB_004c5ae0;
  local_3a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rank,"Slice",(allocator<char> *)&sufficientInputRank);
  validateInputOutputRankEquality
            (__return_storage_ptr__,layer_00,(string *)&rank,&this->blobNameToRank);
  std::__cxx11::string::~string((string *)&rank);
  std::allocator<char>::~allocator((allocator<char> *)&sufficientInputRank);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_3a = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_3a & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  this_00 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
  uVar3 = Specification::Tensor::rank(this_00);
  err.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_90);
  pSVar5 = Specification::NeuralNetworkLayer::slice(local_20);
  SVar4 = Specification::SliceLayerParams::axis(pSVar5);
  if (SVar4 == SliceLayerParams_SliceAxis_CHANNEL_AXIS) {
    if ((int)uVar3 < 3) {
      err.field_2._M_local_buf[0xf] = '\0';
    }
LAB_004c59a7:
    if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::__cxx11::string::string((string *)&slice,(string *)psVar6);
      std::operator+(&local_130,"Slice layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&slice);
      std::operator+(&local_110,&local_130,
                     "\': input\'s rank is smaller than the dimension provided in the axis parameter"
                    );
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&slice);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
      local_38 = 1;
    }
    else {
      local_38 = 0;
    }
  }
  else {
    if (SVar4 == SliceLayerParams_SliceAxis_HEIGHT_AXIS) {
      if ((int)uVar3 < 2) {
        err.field_2._M_local_buf[0xf] = '\0';
      }
      goto LAB_004c59a7;
    }
    if (SVar4 == SliceLayerParams_SliceAxis_WIDTH_AXIS) {
      if ((int)uVar3 < 1) {
        err.field_2._M_local_buf[0xf] = '\0';
      }
      goto LAB_004c59a7;
    }
    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::__cxx11::string::string((string *)&local_f0,(string *)psVar6);
    std::operator+(&local_d0,"Slice layer: \'",&local_f0);
    std::operator+(&local_b0,&local_d0,"\': unknown value for parameter \'axis\'.");
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
    local_38 = 1;
  }
  std::__cxx11::string::~string((string *)local_90);
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
LAB_004c5ae0:
  pSVar5 = Specification::NeuralNetworkLayer::slice(local_20);
  uVar7 = Specification::SliceLayerParams::stride(pSVar5);
  err_1.field_2._12_4_ = (undefined4)uVar7;
  if ((int)err_1.field_2._12_4_ < 1) {
    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                   "Stride length for the slice layer \'",psVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                   "\' must be > 1.");
    std::__cxx11::string::~string((string *)&start);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_180);
    local_38 = 1;
    std::__cxx11::string::~string((string *)local_180);
  }
  else {
    iVar8 = Specification::SliceLayerParams::startindex(pSVar5);
    err_2.field_2._8_8_ = Specification::SliceLayerParams::endindex(pSVar5);
    if ((((long)err_2.field_2._8_8_ < 1) || (iVar8 <= (long)err_2.field_2._8_8_)) &&
       ((-1 < (long)err_2.field_2._8_8_ || ((-1 < iVar8 || (iVar8 <= (long)err_2.field_2._8_8_))))))
    {
      Result::Result(__return_storage_ptr__);
    }
    else {
      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::operator+(&local_1f0,"Slice layer ",psVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     &local_1f0," has an end index before the start index.");
      std::__cxx11::string::~string((string *)&local_1f0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1d0);
      local_38 = 1;
      std::__cxx11::string::~string((string *)local_1d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Slice", blobNameToRank));
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.slice().axis()) {
            case Specification::SliceLayerParams_SliceAxis_CHANNEL_AXIS:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_HEIGHT_AXIS:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_WIDTH_AXIS:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            default:
                err = "Slice layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Slice layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimension provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    const auto& slice = layer.slice();
    int stride = static_cast<int>(slice.stride());
    if (stride < 1) {
        std::string err = "Stride length for the slice layer '" + layer.name() + "' must be > 1.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    int64_t start = (int64_t)slice.startindex();
    int64_t end = slice.endindex();
    if ((end > 0 && end < start )
        || (end < 0 && start < 0 && start > end)) {
        std::string err = "Slice layer " + layer.name() + " has an end index before the start index.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}